

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  Curl_llist_element *pCVar2;
  size_t sVar3;
  Curl_hash_element *he;
  Curl_llist *l;
  Curl_llist_element *le;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table != (Curl_llist *)0x0) {
    pCVar1 = h->table;
    sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
    for (l = (Curl_llist *)pCVar1[sVar3].head; l != (Curl_llist *)0x0; l = (Curl_llist *)l->dtor) {
      pCVar2 = l->head;
      sVar3 = (*h->comp_func)(&pCVar2[1].next,(size_t)pCVar2[1].prev,key,key_len);
      if (sVar3 != 0) {
        return pCVar2[1].ptr;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  if(h->table) {
    DEBUGASSERT(h->slots);
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct Curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}